

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O2

ngx_int_t ngx_create_path(ngx_file_t *file,ngx_path_t *path)

{
  size_t sVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  
  sVar4 = (path->name).len;
  for (lVar5 = 0; (lVar5 != 3 && (sVar1 = path->level[lVar5], sVar1 != 0)); lVar5 = lVar5 + 1) {
    (file->name).data[sVar4 + sVar1 + 1] = '\0';
    if ((file->log->log_level & 0x10) != 0) {
      ngx_log_error_core(8,file->log,0,"temp file: \"%s\"",(file->name).data);
    }
    iVar2 = mkdir((char *)(file->name).data,0x1c0);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0x11) {
        if (file->log->log_level < 3) {
          return -1;
        }
        ngx_log_error_core(3,file->log,*piVar3,"mkdir() \"%s\" failed",(file->name).data);
        return -1;
      }
    }
    sVar4 = sVar4 + sVar1 + 1;
    (file->name).data[sVar4] = '/';
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_create_path(ngx_file_t *file, ngx_path_t *path)
{
    size_t      pos;
    ngx_err_t   err;
    ngx_uint_t  i;

    pos = path->name.len;

    for (i = 0; i < NGX_MAX_PATH_LEVEL; i++) {
        if (path->level[i] == 0) {
            break;
        }

        pos += path->level[i] + 1;

        file->name.data[pos] = '\0';

        ngx_log_debug1(NGX_LOG_DEBUG_CORE, file->log, 0,
                       "temp file: \"%s\"", file->name.data);

        if (ngx_create_dir(file->name.data, 0700) == NGX_FILE_ERROR) {
            err = ngx_errno;
            if (err != NGX_EEXIST) {
                ngx_log_error(NGX_LOG_CRIT, file->log, err,
                              ngx_create_dir_n " \"%s\" failed",
                              file->name.data);
                return NGX_ERROR;
            }
        }

        file->name.data[pos] = '/';
    }

    return NGX_OK;
}